

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::transmitDelayedMessages(CommonCore *this,GlobalFederateId source)

{
  bool bVar1;
  BaseType BVar2;
  ActionMessage *pAVar3;
  key_type *__k;
  BaseType in_ESI;
  long in_RDI;
  ActionMessage *in_stack_00000038;
  CommonCore *in_stack_00000040;
  ActionMessage *delayedMsg;
  iterator __end2_1;
  iterator __begin2_1;
  mapped_type *__range2_1;
  ActionMessage *message;
  iterator __end2;
  iterator __begin2;
  vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *__range2;
  optional<helics::ActionMessage> msg;
  vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> buffer;
  value_type *in_stack_fffffffffffffd98;
  optional<helics::ActionMessage> *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffdb0;
  BaseType in_stack_fffffffffffffdb4;
  ActionMessage *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  __normal_iterator<helics::ActionMessage_*,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
  local_1f8;
  BaseType local_1ec;
  mapped_type *local_1e8;
  BaseType local_1dc;
  reference local_1d8;
  ActionMessage *local_1d0;
  __normal_iterator<helics::ActionMessage_*,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
  local_1c8;
  undefined1 *local_1c0;
  BaseType local_f8;
  undefined1 local_28 [36];
  GlobalFederateId local_4;
  
  local_4.gid = in_ESI;
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::vector
            ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)0x47dff0);
  gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::pop
            ((SimpleQueue<helics::ActionMessage,_std::mutex> *)in_stack_fffffffffffffdd8);
  while (bVar1 = std::optional::operator_cast_to_bool((optional<helics::ActionMessage> *)0x47e01a),
        bVar1) {
    pAVar3 = std::optional<helics::ActionMessage>::operator->
                       ((optional<helics::ActionMessage> *)0x47e030);
    local_f8 = local_4.gid;
    bVar1 = GlobalFederateId::operator==(&pAVar3->source_id,local_4);
    if (bVar1) {
      std::optional<helics::ActionMessage>::operator*((optional<helics::ActionMessage> *)0x47e064);
      routeMessage(in_stack_00000040,in_stack_00000038);
    }
    else {
      std::optional<helics::ActionMessage>::operator*((optional<helics::ActionMessage> *)0x47e0c1);
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                 in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    }
    gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::pop
              ((SimpleQueue<helics::ActionMessage,_std::mutex> *)in_stack_fffffffffffffdd8);
    std::optional<helics::ActionMessage>::operator=
              (in_stack_fffffffffffffda0,
               (optional<helics::ActionMessage> *)in_stack_fffffffffffffd98);
    std::optional<helics::ActionMessage>::~optional((optional<helics::ActionMessage> *)0x47e112);
  }
  bVar1 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::empty
                    ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                     CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  if (!bVar1) {
    local_1c0 = local_28;
    local_1c8._M_current =
         (ActionMessage *)
         std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::begin
                   ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                    in_stack_fffffffffffffd98);
    local_1d0 = (ActionMessage *)
                std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::end
                          ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                           in_stack_fffffffffffffd98);
    while (bVar1 = __gnu_cxx::
                   operator==<helics::ActionMessage_*,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
                             ((__normal_iterator<helics::ActionMessage_*,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
                               *)in_stack_fffffffffffffda0,
                              (__normal_iterator<helics::ActionMessage_*,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
                               *)in_stack_fffffffffffffd98), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_1d8 = __gnu_cxx::
                  __normal_iterator<helics::ActionMessage_*,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
                  ::operator*(&local_1c8);
      gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::push<helics::ActionMessage>
                ((SimpleQueue<helics::ActionMessage,_std::mutex> *)
                 CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                 in_stack_fffffffffffffdd8);
      __gnu_cxx::
      __normal_iterator<helics::ActionMessage_*,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
      ::operator++(&local_1c8);
    }
  }
  __k = (key_type *)(in_RDI + 0x960);
  BVar2 = GlobalFederateId::baseValue(&local_4);
  local_1dc = BVar2;
  std::
  map<int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
  ::operator[]((map<int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
                *)CONCAT44(BVar2,in_stack_fffffffffffffde0),__k);
  bVar1 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::empty
                    ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                     CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_1ec = GlobalFederateId::baseValue(&local_4);
    local_1e8 = std::
                map<int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
                ::operator[]((map<int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
                              *)CONCAT44(BVar2,in_stack_fffffffffffffde0),__k);
    local_1f8._M_current =
         (ActionMessage *)
         std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::begin
                   ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                    in_stack_fffffffffffffd98);
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::end
              ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
               in_stack_fffffffffffffd98);
    while (bVar1 = __gnu_cxx::
                   operator==<helics::ActionMessage_*,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
                             ((__normal_iterator<helics::ActionMessage_*,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
                               *)in_stack_fffffffffffffda0,
                              (__normal_iterator<helics::ActionMessage_*,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
                               *)in_stack_fffffffffffffd98), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<helics::ActionMessage_*,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
      ::operator*(&local_1f8);
      routeMessage(in_stack_00000040,in_stack_00000038);
      __gnu_cxx::
      __normal_iterator<helics::ActionMessage_*,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
      ::operator++(&local_1f8);
    }
    in_stack_fffffffffffffdb4 = GlobalFederateId::baseValue(&local_4);
    std::
    map<int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
    ::operator[]((map<int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
                  *)CONCAT44(BVar2,in_stack_fffffffffffffde0),__k);
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::clear
              ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)0x47e324);
  }
  std::optional<helics::ActionMessage>::~optional((optional<helics::ActionMessage> *)0x47e331);
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::~vector
            ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
             CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  return;
}

Assistant:

void CommonCore::transmitDelayedMessages(GlobalFederateId source)
{
    std::vector<ActionMessage> buffer;
    auto msg = delayTransmitQueue.pop();
    while (msg) {
        if (msg->source_id == source) {
            routeMessage(*msg);
        } else {  // these messages were delayed for a different purpose and will be dealt with in a
                  // different way
            buffer.push_back(std::move(*msg));
        }
        msg = delayTransmitQueue.pop();
    }

    if (!buffer.empty()) {
        for (auto& message : buffer) {
            delayTransmitQueue.push(std::move(message));
        }
    }

    if (!delayedTimingMessages[source.baseValue()].empty()) {
        for (auto& delayedMsg : delayedTimingMessages[source.baseValue()]) {
            routeMessage(delayedMsg);
        }
        delayedTimingMessages[source.baseValue()].clear();
    }
}